

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O2

vec3f Transformed::transformedDir(mat4f *mat,vec3f *v)

{
  vec3f vVar1;
  vec4f vVar2;
  vec3f local_20;
  vec4f local_10;
  
  local_10.x = v->x;
  local_10.y = v->y;
  local_10.z = v->z;
  local_10.w = 0.0;
  vVar2 = operator*(mat,&local_10);
  local_20._0_8_ = vVar2._0_8_;
  local_20.z = vVar2.z;
  vVar1 = normalized(&local_20);
  return vVar1;
}

Assistant:

static vec3f transformedDir(const mat4f& mat, const vec3f& v) {
		return normalized((mat * vec4f(v, 0)).xyz());
	}